

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O3

string * __thiscall
absl::FormatDuration_abi_cxx11_(string *__return_storage_ptr__,absl *this,Duration d)

{
  DisplayUnit unit;
  DisplayUnit unit_00;
  int iVar1;
  string *psVar2;
  undefined1 *puVar3;
  uint uVar4;
  size_type __len1;
  double n;
  Duration num;
  Duration num_00;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  double in_stack_ffffffffffffffb0;
  Duration local_40;
  
  uVar4 = (uint)d.rep_hi_;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_40.rep_lo_ = uVar4;
  local_40.rep_hi_ = (int64_t)this;
  if (uVar4 == 0 && this == (absl *)0x8000000000000000) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"-2562047788015215h30m8s","");
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((long)this < 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"-");
    local_40.rep_lo_ = 0xffffffff;
    if (uVar4 == 0xffffffff) {
      local_40.rep_hi_ = 0x7fffffffffffffff;
    }
    else if (uVar4 == 0) {
      local_40.rep_hi_ = 0x7fffffffffffffff;
      if (this != (absl *)0x8000000000000000) {
        local_40.rep_hi_ = -(long)this;
        local_40.rep_lo_ = 0;
      }
    }
    else {
      local_40.rep_hi_ = ~(ulong)this;
      local_40.rep_lo_ = 4000000000 - uVar4;
    }
  }
  if (local_40.rep_lo_ == 0xffffffff && (absl *)local_40.rep_hi_ == (absl *)0x7fffffffffffffff) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"inf");
    goto LAB_0014e969;
  }
  if (local_40.rep_hi_ < 1) {
    if ((absl *)local_40.rep_hi_ == (absl *)0x0) {
      if (local_40.rep_lo_ < 4000) goto LAB_0014e92a;
      if (local_40.rep_lo_ < 4000000) {
        n = (double)local_40.rep_lo_ / 4000.0;
        puVar3 = (anonymous_namespace)::kDisplayMicro;
      }
      else {
        if (local_40.rep_lo_ == 0xffffffff) {
          n = INFINITY;
        }
        else {
          n = (double)local_40.rep_lo_ / 4000000.0;
        }
        puVar3 = (anonymous_namespace)::kDisplayMilli;
      }
    }
    else if (local_40.rep_lo_ == 0xffffffff) {
      puVar3 = (anonymous_namespace)::kDisplayNano;
      n = -INFINITY;
    }
    else {
LAB_0014e92a:
      n = ((double)local_40.rep_hi_ * 4000000000.0 + (double)local_40.rep_lo_) * 0.25;
      puVar3 = (anonymous_namespace)::kDisplayNano;
    }
  }
  else {
    num.rep_lo_ = local_40.rep_lo_;
    num.rep_hi_ = local_40.rep_hi_;
    num._12_4_ = 0;
    psVar2 = (string *)time_internal::IDivDuration(true,num,(Duration)ZEXT816(0xe10),&local_40);
    unit.abbr._M_str = (char *)in_stack_ffffffffffffffa0;
    unit.abbr._M_len = in_stack_ffffffffffffff98;
    unit._16_8_ = in_stack_ffffffffffffffa8;
    unit.pow10 = in_stack_ffffffffffffffb0;
    anon_unknown_0::AppendNumberUnit((anon_unknown_0 *)__return_storage_ptr__,psVar2,1,unit);
    num_00.rep_lo_ = local_40.rep_lo_;
    num_00.rep_hi_ = local_40.rep_hi_;
    num_00._12_4_ = 0;
    psVar2 = (string *)time_internal::IDivDuration(true,num_00,(Duration)ZEXT816(0x3c),&local_40);
    unit_00.abbr._M_str = (char *)in_stack_ffffffffffffffa0;
    unit_00.abbr._M_len = in_stack_ffffffffffffff98;
    unit_00._16_8_ = in_stack_ffffffffffffffa8;
    unit_00.pow10 = in_stack_ffffffffffffffb0;
    anon_unknown_0::AppendNumberUnit((anon_unknown_0 *)__return_storage_ptr__,psVar2,1,unit_00);
    if (local_40.rep_lo_ == 0xffffffff) {
      n = *(double *)(&DAT_001672e0 + (local_40.rep_hi_ >> 0x3f) * -8);
    }
    else {
      n = ((double)local_40.rep_hi_ * 4000000000.0 + (double)local_40.rep_lo_) / 4000000000.0;
    }
    puVar3 = (anonymous_namespace)::kDisplaySec;
  }
  anon_unknown_0::AppendNumberUnit(__return_storage_ptr__,n,*(DisplayUnit *)puVar3);
LAB_0014e969:
  if (__return_storage_ptr__->_M_string_length == 0) {
    __len1 = 0;
  }
  else {
    iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (__return_storage_ptr__,"-");
    if (iVar1 != 0) {
      return __return_storage_ptr__;
    }
    __len1 = __return_storage_ptr__->_M_string_length;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (__return_storage_ptr__,0,__len1,"0",1);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatDuration(Duration d) {
  const Duration min_duration = Seconds(kint64min);
  if (d == min_duration) {
    // Avoid needing to negate kint64min by directly returning what the
    // following code should produce in that case.
    return "-2562047788015215h30m8s";
  }
  std::string s;
  if (d < ZeroDuration()) {
    s.append("-");
    d = -d;
  }
  if (d == InfiniteDuration()) {
    s.append("inf");
  } else if (d < Seconds(1)) {
    // Special case for durations with a magnitude < 1 second.  The duration
    // is printed as a fraction of a single unit, e.g., "1.2ms".
    if (d < Microseconds(1)) {
      AppendNumberUnit(&s, FDivDuration(d, Nanoseconds(1)), kDisplayNano);
    } else if (d < Milliseconds(1)) {
      AppendNumberUnit(&s, FDivDuration(d, Microseconds(1)), kDisplayMicro);
    } else {
      AppendNumberUnit(&s, FDivDuration(d, Milliseconds(1)), kDisplayMilli);
    }
  } else {
    AppendNumberUnit(&s, IDivDuration(d, Hours(1), &d), kDisplayHour);
    AppendNumberUnit(&s, IDivDuration(d, Minutes(1), &d), kDisplayMin);
    AppendNumberUnit(&s, FDivDuration(d, Seconds(1)), kDisplaySec);
  }
  if (s.empty() || s == "-") {
    s = "0";
  }
  return s;
}